

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sxmlsearch.c
# Opt level: O3

int XMLSearch_free(XMLSearch *search,int free_next)

{
  void *pvVar1;
  int iVar2;
  XMLAttribute *pXVar3;
  long lVar4;
  long lVar5;
  
  iVar2 = 0;
  if ((search != (XMLSearch *)0x0) && (iVar2 = 0, search->init_value == 0x19770522)) {
    if (search->tag != (SXML_CHAR *)0x0) {
      free(search->tag);
      search->tag = (SXML_CHAR *)0x0;
    }
    pXVar3 = search->attributes;
    if (pXVar3 != (XMLAttribute *)0x0) {
      if (0 < search->n_attributes) {
        lVar4 = 0;
        lVar5 = 0;
        do {
          pXVar3 = search->attributes;
          pvVar1 = *(void **)((long)&pXVar3->name + lVar4);
          if (pvVar1 != (void *)0x0) {
            free(pvVar1);
            pXVar3 = search->attributes;
          }
          pvVar1 = *(void **)((long)&pXVar3->value + lVar4);
          if (pvVar1 != (void *)0x0) {
            free(pvVar1);
          }
          lVar5 = lVar5 + 1;
          lVar4 = lVar4 + 0x18;
        } while (lVar5 < search->n_attributes);
        pXVar3 = search->attributes;
      }
      free(pXVar3);
      search->n_attributes = 0;
      search->attributes = (XMLAttribute *)0x0;
    }
    if (search->text != (SXML_CHAR *)0x0) {
      free(search->text);
      search->text = (SXML_CHAR *)0x0;
    }
    if ((free_next != 0) && (search->next != (XMLSearch *)0x0)) {
      XMLSearch_free(search->next,1);
      free(search->next);
    }
    search->tag = (SXML_CHAR *)0x0;
    search->attributes = (XMLAttribute *)0x0;
    search->n_attributes = 0;
    search->text = (SXML_CHAR *)0x0;
    search->next = (_XMLSearch *)0x0;
    search->prev = (_XMLSearch *)0x0;
    search->stop_at = (XMLNode *)0xffffffffffffffff;
    search->init_value = 0x19770522;
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int XMLSearch_free(XMLSearch* search, int free_next)
{
	int i;

	if (search == NULL || search->init_value != XML_INIT_DONE)
		return FALSE;

	if (search->tag != NULL) {
		__free(search->tag);
		search->tag = NULL;
	}

	if (search->attributes != NULL) {
		for (i = 0; i < search->n_attributes; i++) {
			if (search->attributes[i].name != NULL)
				__free(search->attributes[i].name);
			if (search->attributes[i].value != NULL)
				__free(search->attributes[i].value);
		}
		__free(search->attributes);
		search->n_attributes = 0;
		search->attributes = NULL;
	}

	if (search->text != NULL) {
		__free(search->text);
		search->text = NULL;
	}

	if (free_next && search->next != NULL) {
		(void)XMLSearch_free(search->next, TRUE);
		__free(search->next);
		search->next = NULL;
	}
	search->init_value = 0; /* Something not XML_INIT_DONE, otherwise we'll go into 'XMLSearch_free' again */
	(void)XMLSearch_init(search);

	return TRUE;
}